

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O3

int __thiscall asl::File::open(File *this,char *__file,int __oflag,...)

{
  uint uVar1;
  FILE *pFVar2;
  undefined8 extraout_RAX;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  char cVar6;
  char *__filename;
  char *b;
  char fopen_mode [8];
  char local_20 [8];
  
  b = __file + 8;
  __filename = b;
  if (*(int *)__file != 0) {
    __filename = *(char **)(__file + 8);
  }
  if (*__filename == '\0') {
    return 0;
  }
  uVar3 = __oflag & 3;
  if (uVar3 == 1) {
    local_20[0] = 'w';
LAB_00132c31:
    pcVar4 = local_20 + 1;
    cVar6 = 't';
    if ((__oflag & 8U) == 0) {
      cVar6 = 'b';
    }
    uVar1 = 2;
  }
  else {
    if (uVar3 == 2) {
      local_20[0] = 'a';
      goto LAB_00132c31;
    }
    local_20[1] = 0x74;
    if ((__oflag & 8U) == 0) {
      local_20[1] = 0x62;
    }
    local_20[0] = 'r';
    uVar1 = 2;
    if (uVar3 != 3) goto LAB_00132c51;
    pcVar4 = local_20 + 2;
    uVar1 = 3;
    cVar6 = '+';
  }
  *pcVar4 = cVar6;
LAB_00132c51:
  if ((__oflag & 4U) != 0) {
    uVar5 = (ulong)uVar1;
    uVar1 = uVar1 + 1;
    local_20[uVar5] = 'x';
  }
  local_20[uVar1] = '\0';
  pFVar2 = fopen(__filename,local_20);
  this->_file = (FILE *)pFVar2;
  if (*(int *)__file != 0) {
    b = *(char **)(__file + 8);
  }
  String::assign(&this->_path,b,*(int *)(__file + 4));
  return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),this->_file != (FILE *)0x0);
}

Assistant:

bool File::open(const String& name, File::OpenMode mode)
{
	if(name == "")
		return false;
	CHART fopen_mode[8];
	int   i = 0;
	switch (mode & (READ | WRITE | APPEND | RW))
	{
	case WRITE:
		fopen_mode[i++] = STR_PREFIX('w');
		break;
	case APPEND:
		fopen_mode[i++] = STR_PREFIX('a');
		break;
	default:
		fopen_mode[i++] = STR_PREFIX('r');
		break;
	}

	fopen_mode[i++] = (mode & TEXT) ? STR_PREFIX('t') : STR_PREFIX('b');

	if ((mode & (READ | WRITE | APPEND | RW)) == RW)
		fopen_mode[i++] = STR_PREFIX('+');

#if !defined _MSC_VER || _MSC_VER >= 1900
	if (mode & CREATE)
		fopen_mode[i++] = STR_PREFIX('x');
#endif

	fopen_mode[i] = 0;

	_file = fopenX(name, fopen_mode);

	_path = name;

	return _file != 0;
}